

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

void RegexTree::firstpos(tree_node *ptr,StateSet *s)

{
  bool bVar1;
  StateSet *s_local;
  tree_node *ptr_local;
  
  if ((ptr != (tree_node *)0x0) && (ptr->c != '\a')) {
    s_local = (StateSet *)ptr;
    if ((ptr->left == (tree_node *)0x0) && (ptr->right == (tree_node *)0x0)) {
      std::
      unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
      ::insert(s,(value_type *)&s_local);
    }
    if (*(char *)&(s_local->_M_h)._M_before_begin._M_nxt == '\n') {
      firstpos((tree_node *)(s_local->_M_h)._M_buckets,s);
      firstpos((tree_node *)(s_local->_M_h)._M_bucket_count,s);
    }
    else if (*(char *)&(s_local->_M_h)._M_before_begin._M_nxt == '\b') {
      bVar1 = nullable((tree_node *)(s_local->_M_h)._M_buckets);
      if (bVar1) {
        firstpos((tree_node *)(s_local->_M_h)._M_buckets,s);
        firstpos((tree_node *)(s_local->_M_h)._M_bucket_count,s);
      }
      else {
        firstpos((tree_node *)(s_local->_M_h)._M_buckets,s);
      }
    }
    else if (*(char *)&(s_local->_M_h)._M_before_begin._M_nxt == '\t') {
      firstpos((tree_node *)(s_local->_M_h)._M_buckets,s);
    }
  }
  return;
}

Assistant:

void RegexTree::firstpos(const tree_node *ptr, RegexTree::StateSet &s) {
    if (ptr == nullptr || ptr->c == EPSILON) return;
    if (ptr->left == nullptr && ptr->right == nullptr)
        s.insert(ptr);
    if (ptr->c == OR) {
        firstpos(ptr->left, s);
        firstpos(ptr->right, s);
        return;
    }
    if (ptr->c == CAT) {
        if (nullable(ptr->left)) {
            firstpos(ptr->left, s);
            firstpos(ptr->right, s);
        } else
            firstpos(ptr->left, s);
        return;
    }
    if (ptr->c == STAR)
        firstpos(ptr->left, s);
}